

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void QApplicationPrivate::giveFocusAccordingToFocusPolicy
               (QWidget *widget,QEvent *event,QPoint localPos)

{
  ushort uVar1;
  QWidgetData *pQVar2;
  long lVar3;
  Data *pDVar4;
  char cVar5;
  bool bVar6;
  Data *pDVar7;
  QPoint QVar8;
  QWidget *pQVar9;
  FocusPolicy policy;
  long in_FS_OFFSET;
  QPoint local_40;
  undefined8 local_38;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = localPos;
  QGuiApplication::styleHints();
  cVar5 = QStyleHints::setFocusOnTouchRelease();
  if (giveFocusAccordingToFocusPolicy(QWidget*,QEvent*,QPoint)::focusedWidgetOnTouchBegin == '\0') {
    giveFocusAccordingToFocusPolicy();
  }
  pQVar9 = focus_widget;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x1f) {
    if (uVar1 != 2) {
      if (uVar1 == 3) {
LAB_002bfc13:
        if (cVar5 == '\0') goto LAB_002bfd67;
        if ((giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d == (Data *)0x0) ||
           (pQVar9 = (QWidget *)giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.value,
           *(int *)(giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d + 4) == 0)) {
          pQVar9 = (QWidget *)0x0;
        }
        if (pQVar9 != focus_widget) goto LAB_002bfd67;
        policy = ClickFocus;
        goto LAB_002bfc8e;
      }
      if (uVar1 != 4) goto LAB_002bfd67;
    }
LAB_002bfbfa:
    if (focus_widget == (QWidget *)0x0) {
      pDVar7 = (Data *)0x0;
    }
    else {
      pDVar7 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                 (&focus_widget->super_QObject);
    }
    pDVar4 = giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d;
    giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.value = &pQVar9->super_QObject;
    if (giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d != (Data *)0x0) {
      LOCK();
      *(int *)giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d =
           *(int *)giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d + -1;
      giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d = pDVar7;
      UNLOCK();
      pDVar7 = giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d;
      if (*(int *)pDVar4 == 0) {
        operator_delete(pDVar4);
        pDVar7 = giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d;
      }
    }
    giveFocusAccordingToFocusPolicy::focusedWidgetOnTouchBegin.wp.d = pDVar7;
    policy = ClickFocus;
    if (cVar5 != '\0') goto LAB_002bfd67;
  }
  else {
    if (uVar1 != 0x1f) {
      if (uVar1 == 0xc4) goto LAB_002bfc13;
      if (uVar1 != 0xc2) goto LAB_002bfd67;
      goto LAB_002bfbfa;
    }
    policy = WheelFocus;
  }
LAB_002bfc8e:
  if (widget != (QWidget *)0x0) {
    do {
      pQVar2 = widget->data;
      if ((pQVar2->widget_attributes & 1) == 0) {
        local_38 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                            (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
        local_40.xp.m_i = 0;
        local_40.yp.m_i = 0;
        cVar5 = QRect::contains(&local_40,SUB81(&local_30,0));
        if ((cVar5 != '\0') && (bVar6 = shouldSetFocus(widget,policy), bVar6)) {
          QWidget::setFocus(widget,MouseFocusReason);
          break;
        }
      }
      if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) break;
      lVar3 = *(long *)(*(long *)&widget->field_0x8 + 0x78);
      pQVar9 = widget;
      if ((((lVar3 != 0) && (*(long *)(lVar3 + 0x30) != 0)) &&
          (*(int *)(*(long *)(lVar3 + 0x30) + 4) != 0)) &&
         (*(QWidget **)(lVar3 + 0x38) != (QWidget *)0x0)) {
        pQVar9 = *(QWidget **)(lVar3 + 0x38);
      }
      bVar6 = QWidget::hasFocus(pQVar9);
      if (bVar6) break;
      QVar8 = QWidget::pos(widget);
      local_30.yp.m_i = local_30.yp.m_i + QVar8.yp.m_i.m_i;
      local_30.xp.m_i = local_30.xp.m_i + QVar8.xp.m_i.m_i;
      widget = *(QWidget **)(*(long *)&widget->field_0x8 + 0x10);
    } while (widget != (QWidget *)0x0);
  }
LAB_002bfd67:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::giveFocusAccordingToFocusPolicy(QWidget *widget, QEvent *event, QPoint localPos)
{
    const bool setFocusOnRelease = QGuiApplication::styleHints()->setFocusOnTouchRelease();
    Qt::FocusPolicy focusPolicy = Qt::ClickFocus;
    static QPointer<QWidget> focusedWidgetOnTouchBegin = nullptr;

    switch (event->type()) {
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonDblClick:
        case QEvent::TouchBegin:
            focusedWidgetOnTouchBegin = QApplication::focusWidget();
            if (setFocusOnRelease)
                return;
            break;
        case QEvent::MouseButtonRelease:
        case QEvent::TouchEnd:
            if (!setFocusOnRelease)
                return;
            if (focusedWidgetOnTouchBegin != QApplication::focusWidget()) {
                // Focus widget was changed while delivering press/move events.
                // To not interfere with application logic, we leave focus as-is
                return;
            }
            break;
        case QEvent::Wheel:
            focusPolicy = Qt::WheelFocus;
            break;
        default:
            return;
    }

    QWidget *focusWidget = widget;
    while (focusWidget) {
        if (focusWidget->isEnabled()
            && focusWidget->rect().contains(localPos)
            && QApplicationPrivate::shouldSetFocus(focusWidget, focusPolicy)) {
            focusWidget->setFocus(Qt::MouseFocusReason);
            break;
        }
        if (focusWidget->isWindow())
            break;

        // find out whether this widget (or its proxy) already has focus
        QWidget *f = focusWidget;
        if (focusWidget->d_func()->extra && focusWidget->d_func()->extra->focus_proxy)
            f = focusWidget->d_func()->extra->focus_proxy;
        // if it has, stop here.
        // otherwise a click on the focused widget would remove its focus if ClickFocus isn't set
        if (f->hasFocus())
            break;

        localPos += focusWidget->pos();
        focusWidget = focusWidget->parentWidget();
    }
}